

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNSum.cpp
# Opt level: O0

int __thiscall
NaPNSum::verify(NaPNSum *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  NaVector *pNVar5;
  char *pcVar6;
  ulong uVar7;
  bool bVar8;
  bool bGoodGain;
  bool local_1f;
  
  pNVar5 = NaPetriCnInput::data((NaPetriCnInput *)this);
  uVar1 = (*pNVar5->_vptr_NaVector[6])();
  uVar2 = NaVector::dim(&this->vAuxGain);
  if ((uVar1 == uVar2) && (uVar1 = NaVector::dim(&this->vAuxGain), uVar1 != 0)) {
    pNVar5 = NaPetriCnInput::data((NaPetriCnInput *)this);
    uVar1 = (*pNVar5->_vptr_NaVector[6])();
    uVar2 = NaVector::dim(&this->vMainGain);
    if (uVar1 == uVar2) {
      uVar1 = NaVector::dim(&this->vMainGain);
      bVar8 = true;
      if (uVar1 != 0) goto LAB_00152ccc;
    }
  }
  uVar1 = NaVector::dim(&this->vAuxGain);
  if (uVar1 == 1) {
    uVar1 = NaVector::dim(&this->vMainGain);
    bVar8 = true;
    if (uVar1 == 1) goto LAB_00152ccc;
  }
  uVar1 = NaVector::dim(&this->vAuxGain);
  bVar8 = false;
  if (uVar1 == 0) {
    uVar1 = NaVector::dim(&this->vMainGain);
    bVar8 = uVar1 == 0;
  }
LAB_00152ccc:
  if (!bVar8) {
    pcVar6 = NaPetriNode::name(&this->super_NaPetriNode);
    NaPrintLog("Node \'%s\' has mismatched gain dimension\n",pcVar6);
  }
  uVar7 = 0;
  local_1f = false;
  if (bVar8) {
    pNVar5 = NaPetriCnInput::data((NaPetriCnInput *)this);
    iVar3 = (*pNVar5->_vptr_NaVector[6])();
    pNVar5 = NaPetriCnInput::data((NaPetriCnInput *)this);
    iVar4 = (*pNVar5->_vptr_NaVector[6])();
    uVar7 = 0;
    local_1f = false;
    if (iVar3 == iVar4) {
      pNVar5 = NaPetriCnInput::data((NaPetriCnInput *)this);
      iVar3 = (*pNVar5->_vptr_NaVector[6])();
      pNVar5 = NaPetriCnOutput::data(&this->sum);
      iVar4 = (*pNVar5->_vptr_NaVector[6])();
      local_1f = iVar3 == iVar4;
      uVar7 = (ulong)CONCAT31((int3)((uint)iVar3 >> 8),local_1f);
    }
  }
  return (int)CONCAT71((int7)(uVar7 >> 8),local_1f);
}

Assistant:

bool
NaPNSum::verify ()
{
  /* check gain dimension */
  bool	bGoodGain =
    (aux.data().dim() == vAuxGain.dim() && 0 != vAuxGain.dim() &&
     main.data().dim() == vMainGain.dim() && 0 != vMainGain.dim()) ||
    (1 == vAuxGain.dim() && 1 == vMainGain.dim()) ||
    (0 == vAuxGain.dim() && 0 == vMainGain.dim());

  if(!bGoodGain)
    NaPrintLog("Node '%s' has mismatched gain dimension\n", name());

  return bGoodGain
    && main.data().dim() == aux.data().dim()
    && main.data().dim() == sum.data().dim();
}